

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O2

void __thiscall xmrig::Worker::storeStats(Worker *this)

{
  uint64_t uVar1;
  
  (this->m_hashCount).super___atomic_base<unsigned_long>._M_i = this->m_count;
  uVar1 = Chrono::highResolutionMSecs();
  (this->m_timestamp).super___atomic_base<unsigned_long>._M_i = uVar1;
  return;
}

Assistant:

void xmrig::Worker::storeStats()
{
    m_hashCount.store(m_count, std::memory_order_relaxed);
    m_timestamp.store(Chrono::highResolutionMSecs(), std::memory_order_relaxed);
}